

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  PipelineHook *pPVar1;
  Array<capnp::PipelineOp> *pAVar2;
  Own<capnp::ClientHook,_std::nullptr_t> *this_00;
  ClientHook *pCVar3;
  Own<capnp::PipelineHook,_std::nullptr_t> *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  Own<capnp::ClientHook,_std::nullptr_t> OVar4;
  Type local_50;
  ArrayPtr<const_char> local_40;
  Own<capnp::PipelineHook,_std::nullptr_t> *local_30;
  Own<capnp::PipelineHook,_std::nullptr_t> *r;
  Own<capnp::PipelineHook,_std::nullptr_t> *_r496;
  Array<capnp::PipelineOp> *ops_local;
  QueuedPipeline *this_local;
  
  _r496 = in_RDX;
  ops_local = ops;
  this_local = this;
  local_30 = kj::_::readMaybe<capnp::PipelineHook,decltype(nullptr)>
                       ((Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)&ops[1].disposer);
  r = local_30;
  if (local_30 == (Own<capnp::PipelineHook,_std::nullptr_t> *)0x0) {
    local_40 = (ArrayPtr<const_char>)
               kj::Array<capnp::PipelineOp>::asPtr((Array<capnp::PipelineOp> *)_r496);
    local_50.ops = (Array<capnp::PipelineOp> *)_r496;
    local_50.this = (QueuedPipeline *)ops;
    this_00 = kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              ::
              findOrCreate<kj::ArrayPtr<capnp::PipelineOp>,capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0>
                        ((HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                          *)&ops[2].disposer,(StringPtr *)&local_40,&local_50);
    pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(this_00);
    (*pCVar3->_vptr_ClientHook[4])(this);
    pCVar3 = extraout_RDX_00;
  }
  else {
    pPVar1 = kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator->(local_30);
    pAVar2 = kj::mv<kj::Array<capnp::PipelineOp>>((Array<capnp::PipelineOp> *)_r496);
    (*pPVar1->_vptr_PipelineHook[2])(this,pPVar1,pAVar2);
    pCVar3 = extraout_RDX;
  }
  OVar4.ptr = pCVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_SOME(r, redirect) {
    return r->getPipelinedCap(kj::mv(ops));
  } else {
    return clientMap.findOrCreate(ops.asPtr(), [&]() {
      auto clientPromise = promise.addBranch()
          .then([ops = KJ_MAP(op, ops) { return op; }](kj::Own<PipelineHook> pipeline) {
        return pipeline->getPipelinedCap(kj::mv(ops));
      });
      return kj::HashMap<kj::Array<PipelineOp>, kj::Own<ClientHook>>::Entry {
        kj::mv(ops), kj::refcounted<QueuedClient>(kj::mv(clientPromise))
      };
    })->addRef();
  }
}